

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

Vec_Ptr_t * Aig_ManRegPartitionTraverse(Aig_Man_t *p)

{
  void *pvVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  pVVar3 = p->vCis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(int *)((long)pVVar3->pArray[lVar2] + 0x28) = (int)lVar2;
      lVar2 = lVar2 + 1;
      pVVar3 = p->vCis;
    } while (lVar2 < pVVar3->nSize);
  }
  iVar9 = p->nRegs;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar9 - 1U) {
    iVar6 = iVar9;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar3->pArray = ppvVar4;
  Aig_ManIncrementTravId(p);
  uVar7 = p->nObjs[3] - p->nRegs;
  pVVar5 = p->vCos;
  if ((int)uVar7 < pVVar5->nSize) {
    uVar10 = (ulong)uVar7;
    uVar8 = 1;
    iVar9 = 0;
    do {
      if ((int)uVar7 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pVVar5->pArray[uVar10];
      printf("Latch %d: ",(ulong)uVar8);
      Aig_ManRegPartitionTraverse_rec
                (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),pVVar3);
      printf("%d=%d \n",(ulong)uVar8,(ulong)(uint)(pVVar3->nSize - iVar9));
      iVar9 = pVVar3->nSize;
      uVar10 = uVar10 + 1;
      pVVar5 = p->vCos;
      uVar8 = uVar8 + 1;
    } while ((int)uVar10 < pVVar5->nSize);
  }
  printf("Total collected = %d. Total regs = %d.\n",(ulong)(uint)pVVar3->nSize,(ulong)(uint)p->nRegs
        );
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionTraverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vLos;
    Aig_Obj_t * pObj;
    int i, nPrev, Counter;
    // mark the registers
    Aig_ManForEachCi( p, pObj, i )
       pObj->iData = i; 
    // collect registers
    vLos = Vec_PtrAlloc( Aig_ManRegNum(p) );
    nPrev = 0;
    Counter = 0;
    Aig_ManIncrementTravId( p );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        ++Counter;
        printf( "Latch %d: ", Counter );
        Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
printf( "%d=%d \n", Counter, Vec_PtrSize(vLos)-nPrev );
        nPrev = Vec_PtrSize(vLos);
    }
    printf( "Total collected = %d. Total regs = %d.\n", Vec_PtrSize(vLos), Aig_ManRegNum(p) );
    return vLos;
}